

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

uint strHash(char *z)

{
  uchar c;
  uint h;
  char *z_local;
  
  h = 0;
  z_local = z;
  while( true ) {
    if (*z_local == 0) break;
    h = (""[(byte)*z_local] + h) * -0x61c8864f;
    z_local = z_local + 1;
  }
  return h;
}

Assistant:

static unsigned int strHash(const char *z){
  unsigned int h = 0;
  unsigned char c;
  while( (c = (unsigned char)*z++)!=0 ){     /*OPTIMIZATION-IF-TRUE*/
    /* Knuth multiplicative hashing.  (Sorting & Searching, p. 510).
    ** 0x9e3779b1 is 2654435761 which is the closest prime number to
    ** (2**32)*golden_ratio, where golden_ratio = (sqrt(5) - 1)/2. */
    h += sqlite3UpperToLower[c];
    h *= 0x9e3779b1;
  }
  return h;
}